

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  char cVar1;
  char *pcVar2;
  cmOutputConverter *this_00;
  string line;
  string color_name;
  string cmd;
  string local_d0;
  string local_b0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  if (((((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
        ToolSupportsColor == true) && (this->ColorMakefile == true)) && (color - EchoDepend < 5)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_90,0,(char *)0x0,
               (ulong)(&DAT_004dc730 + *(int *)(&DAT_004dc730 + (ulong)(color - EchoDepend) * 4)));
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_b0);
  pcVar2 = (text->_M_dataplus)._M_p;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    cVar1 = *pcVar2;
    if (cVar1 != '\r') {
      if (cVar1 == '\n') {
LAB_0033b2bb:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        if (local_88 == 0 && progress == (EchoProgress *)0x0) {
          std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x4dc165);
          cmOutputConverter::EscapeForShell(&local_d0,this_00,&local_b0,false,true,false);
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x4dc16c);
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
          if (progress != (EchoProgress *)0x0) {
            std::__cxx11::string::append((char *)&local_70);
            cmsys::SystemTools::CollapseFullPath(&local_50,&progress->Dir);
            cmOutputConverter::ConvertToOutputFormat(&local_d0,this_00,&local_50,SHELL);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            std::__cxx11::string::append((char *)&local_70);
            std::__cxx11::string::_M_append
                      ((char *)&local_70,(ulong)(progress->Arg)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_70);
          }
          cmOutputConverter::EscapeForShell(&local_d0,this_00,&local_b0,false,false,false);
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        if (cVar1 != '\0') {
          std::__cxx11::string::push_back((char)&local_b0);
          goto LAB_0033b4be;
        }
        if (local_b0._M_string_length != 0) goto LAB_0033b2bb;
      }
      local_b0._M_string_length = 0;
      *local_b0._M_dataplus._M_p = '\0';
      if (*pcVar2 == '\0') {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
        return;
      }
      progress = (EchoProgress *)0x0;
    }
LAB_0033b4be:
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendEcho(
  std::vector<std::string>& commands, std::string const& text, EchoColor color,
  EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if (this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile) {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch (color) {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
    }
  }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for (const char* c = text.c_str();; ++c) {
    if (*c == '\n' || *c == '\0') {
      // Avoid writing a blank last line on end-of-string.
      if (*c != '\0' || !line.empty()) {
        // Add a command to echo this line.
        std::string cmd;
        if (color_name.empty() && !progress) {
          // Use the native echo command.
          cmd = "@echo ";
          cmd += this->EscapeForShell(line, false, true);
        } else {
          // Use cmake to echo the text in color.
          cmd = "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ";
          cmd += color_name;
          if (progress) {
            cmd += "--progress-dir=";
            cmd += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(progress->Dir),
              cmOutputConverter::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
          }
          cmd += this->EscapeForShell(line);
        }
        commands.push_back(std::move(cmd));
      }

      // Reset the line to empty.
      line.clear();

      // Progress appears only on first line.
      progress = nullptr;

      // Terminate on end-of-string.
      if (*c == '\0') {
        return;
      }
    } else if (*c != '\r') {
      // Append this character to the current line.
      line += *c;
    }
  }
}